

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O2

void nrg::InstantExecution::push<TimedCaller>(Queue *queue,TimedCaller *fn)

{
  QueueElement elem;
  function<void_()> fStack_78;
  function<void_()> local_58;
  TimedCaller local_38;
  
  TimedCaller::TimedCaller(&local_38,fn);
  std::function<void()>::
  function<nrg::InstantExecution::push<TimedCaller>(std::queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>&,TimedCaller)::_lambda()_1_,void>
            ((function<void()> *)&local_58,(anon_class_40_1_3fcf6586 *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::function<void_()>::function(&fStack_78,&local_58);
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)queue,&fStack_78)
  ;
  std::_Function_base::~_Function_base(&fStack_78.super__Function_base);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }